

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O0

void __thiscall embree::MutexSys::MutexSys(MutexSys *this)

{
  int iVar1;
  void *pvVar2;
  runtime_error *this_00;
  undefined8 *in_RDI;
  
  pvVar2 = ::operator_new(0x28);
  *in_RDI = pvVar2;
  iVar1 = pthread_mutex_init((pthread_mutex_t *)*in_RDI,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"pthread_mutex_init failed");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

MutexSys::MutexSys() 
  { 
    mutex = new pthread_mutex_t; 
    if (pthread_mutex_init((pthread_mutex_t*)mutex, nullptr) != 0)
      THROW_RUNTIME_ERROR("pthread_mutex_init failed");
  }